

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmldoc.cpp
# Opt level: O0

string * __thiscall
libcellml::XmlDoc::prettyPrint_abi_cxx11_(string *__return_storage_ptr__,XmlDoc *this)

{
  stringstream local_1b0 [8];
  stringstream res;
  ostream local_1a0 [380];
  undefined4 local_24;
  uchar *puStack_20;
  int size;
  xmlChar *buffer;
  XmlDoc *this_local;
  
  local_24 = 0;
  buffer = (xmlChar *)this;
  this_local = (XmlDoc *)__return_storage_ptr__;
  xmlDocDumpFormatMemoryEnc(this->mPimpl->mXmlDocPtr,&stack0xffffffffffffffe0,&local_24,"UTF-8",1);
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::operator<<(local_1a0,puStack_20);
  (*_xmlFree)(puStack_20);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string XmlDoc::prettyPrint() const
{
    xmlChar *buffer;
    int size = 0;
    xmlDocDumpFormatMemoryEnc(mPimpl->mXmlDocPtr, &buffer, &size, "UTF-8", 1);
    std::stringstream res;
    res << buffer;
    xmlFree(buffer);
    return res.str();
}